

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O0

void M680X_get_insn_id(cs_struct *handle,cs_insn *insn,uint id)

{
  long *plVar1;
  char cVar2;
  int iVar3;
  uint in_EDX;
  uint *in_RSI;
  long in_RDI;
  int i;
  int index;
  uint8_t insn_prefix;
  cpu_tables *cpu;
  m680x_info *info;
  uint local_38;
  uint local_34;
  
  plVar1 = *(long **)(*(long *)(in_RDI + 0x10) + 0xf0);
  cVar2 = (char)(in_EDX >> 8);
  *in_RSI = 0x9f;
  local_34 = 0;
  while (((local_34 < 3 && (plVar1[(long)(int)local_34 + 9] != 0)) &&
         (plVar1[(long)(int)local_34 + 6] != 0))) {
    if (*(char *)((long)plVar1 + (long)(int)local_34 + 0x28) == cVar2) {
      iVar3 = binary_search((inst_pageX *)plVar1[(long)(int)local_34 + 6],
                            (int)plVar1[(long)(int)local_34 + 9],(uint8_t)in_EDX);
      if (iVar3 < 0) {
        local_38 = 0x9f;
      }
      else {
        local_38 = *(uint *)(plVar1[(long)(int)local_34 + 6] + (long)iVar3 * 4) >> 8 & 0x1ff;
      }
      *in_RSI = local_38;
      return;
    }
    local_34 = local_34 + 1;
  }
  if ((cVar2 == '\0') && (*in_RSI = *(uint *)(*plVar1 + (ulong)in_EDX * 4) & 0x1ff, *in_RSI == 0x9f)
     ) {
    local_34 = 0;
    while( true ) {
      if (1 < local_34) {
        return;
      }
      if (plVar1[(long)(int)local_34 + 3] == 0) {
        return;
      }
      if (plVar1[(long)(int)local_34 + 1] == 0) {
        return;
      }
      iVar3 = binary_search((inst_pageX *)plVar1[(long)(int)local_34 + 1],
                            (int)plVar1[(long)(int)local_34 + 3],(uint8_t)in_EDX);
      if (-1 < iVar3) break;
      local_34 = local_34 + 1;
    }
    *in_RSI = *(uint *)(plVar1[(long)(int)local_34 + 1] + (long)iVar3 * 4) >> 8 & 0x1ff;
  }
  return;
}

Assistant:

void M680X_get_insn_id(cs_struct *handle, cs_insn *insn, unsigned int id)
{
	const m680x_info *const info = (const m680x_info *)handle->printer_info;
	const cpu_tables *cpu = info->cpu;
	uint8_t insn_prefix = (id >> 8) & 0xff;
	int index;
	int i;

	insn->id = M680X_INS_ILLGL;

	for (i = 0; i < ARR_SIZE(cpu->pageX_prefix); ++i) {
		if (cpu->pageX_table_size[i] == 0 ||
			(cpu->inst_pageX_table[i] == NULL))
			break;

		if (cpu->pageX_prefix[i] == insn_prefix) {
			index = binary_search(cpu->inst_pageX_table[i],
					cpu->pageX_table_size[i], id & 0xff);
			insn->id = (index >= 0) ?
				cpu->inst_pageX_table[i][index].insn :
				M680X_INS_ILLGL;
			return;
		}
	}

	if (insn_prefix != 0)
		return;

	insn->id = cpu->inst_page1_table[id].insn;

	if (insn->id != M680X_INS_ILLGL)
		return;

	// Check if opcode byte is present in an overlay table
	for (i = 0; i < ARR_SIZE(cpu->overlay_table_size); ++i) {
		if (cpu->overlay_table_size[i] == 0 ||
			(cpu->inst_overlay_table[i] == NULL))
			break;

		if ((index = binary_search(cpu->inst_overlay_table[i],
						cpu->overlay_table_size[i],
						id & 0xff)) >= 0) {
			insn->id = cpu->inst_overlay_table[i][index].insn;
			return;
		}
	}
}